

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O2

int Io_WriteMoPlaOneIntMintermsM(FILE *pFile,Abc_Ntk_t *pNtk,DdManager *dd,DdNode *bFunc,int nMints)

{
  int *array;
  DdNode **__ptr;
  Abc_Obj_t *pAVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  iVar3 = dd->size;
  array = (int *)calloc((long)iVar3,4);
  __ptr = Cudd_bddPickArbitraryMinterms(dd,bFunc,dd->vars,iVar3,nMints);
  if (dd->size != pNtk->vCis->nSize) {
    __assert_fail("dd->size == Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWritePla.c"
                  ,0x1d3,
                  "int Io_WriteMoPlaOneIntMintermsM(FILE *, Abc_Ntk_t *, DdManager *, DdNode *, int)"
                 );
  }
  fprintf((FILE *)pFile,".i %d\n");
  fprintf((FILE *)pFile,".o %d\n",1);
  fwrite(".ilb",4,1,(FILE *)pFile);
  for (iVar3 = 0; iVar3 < pNtk->vCis->nSize; iVar3 = iVar3 + 1) {
    pAVar1 = Abc_NtkCi(pNtk,iVar3);
    pcVar2 = Abc_ObjName(pAVar1);
    fprintf((FILE *)pFile," %s",pcVar2);
  }
  fputc(10,(FILE *)pFile);
  fwrite(".ob",3,1,(FILE *)pFile);
  uVar6 = 0;
  pAVar1 = Abc_NtkCo(pNtk,0);
  pcVar2 = Abc_ObjName(pAVar1);
  fprintf((FILE *)pFile," %s",pcVar2);
  fputc(10,(FILE *)pFile);
  fprintf((FILE *)pFile,".p %d\n",(ulong)(uint)nMints);
  uVar4 = (ulong)(uint)nMints;
  if (nMints < 1) {
    uVar4 = uVar6;
  }
  for (; uVar6 != uVar4; uVar6 = uVar6 + 1) {
    Cudd_BddToCubeArray(dd,__ptr[uVar6],array);
    for (lVar5 = 0; lVar5 < pNtk->vCis->nSize; lVar5 = lVar5 + 1) {
      if ((ulong)(uint)array[lVar5] < 3) {
        fputc(*(int *)(&DAT_007c60e8 + (ulong)(uint)array[lVar5] * 4),(FILE *)pFile);
      }
    }
    fputc(0x20,(FILE *)pFile);
    fputc(0x31,(FILE *)pFile);
    fputc(10,(FILE *)pFile);
  }
  fwrite(".e\n",3,1,(FILE *)pFile);
  free(__ptr);
  free(array);
  return 1;
}

Assistant:

int Io_WriteMoPlaOneIntMintermsM( FILE * pFile, Abc_Ntk_t * pNtk, DdManager * dd, DdNode * bFunc, int nMints )
{
    Abc_Obj_t * pNode;
    int * pArray = ABC_CALLOC( int, dd->size );
    DdNode ** pbMints = Cudd_bddPickArbitraryMinterms( dd, bFunc, dd->vars, dd->size, nMints );
    int i, k, nInputs = Abc_NtkCiNum(pNtk);
    assert( dd->size == Abc_NtkCiNum(pNtk) );

    // write the header
    fprintf( pFile, ".i %d\n", nInputs );
    fprintf( pFile, ".o %d\n", 1 );
    fprintf( pFile, ".ilb" );
    Abc_NtkForEachCi( pNtk, pNode, i )
        fprintf( pFile, " %s", Abc_ObjName(pNode) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".ob" );
    fprintf( pFile, " %s", Abc_ObjName(Abc_NtkCo(pNtk, 0)) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".p %d\n", nMints );

    // iterate through minterms
    for ( k = 0; k < nMints; k++ )
    {
        Cudd_BddToCubeArray( dd, pbMints[k], pArray );
        for ( i = 0; i < Abc_NtkCiNum(pNtk); i++ )
            if ( pArray[i] == 0 )
                fprintf( pFile, "%c", '0' );
            else if ( pArray[i] == 1 )
                fprintf( pFile, "%c", '1' );
            else if ( pArray[i] == 2 )
                fprintf( pFile, "%c", '-' );
        fprintf( pFile, " " );
        fprintf( pFile, "%c", '1' );
        fprintf( pFile, "\n" );
    }
    fprintf( pFile, ".e\n" );

    //for ( k = 0; k < nMints; k++ )
    //    Cudd_RecursiveDeref( dd, pbMints[k] );
    ABC_FREE( pbMints );
    ABC_FREE( pArray );
    return 1;
}